

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O3

void Rand_state_init(uint32_t seed)

{
  long lVar1;
  ulong uVar2;
  uint32_t uVar3;
  int iVar4;
  
  lVar1 = 1;
  STATE[0] = seed;
  do {
    seed = seed * 0x41c64e6d + 0x3039;
    STATE[lVar1] = seed;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x20);
  uVar2 = (ulong)state_i;
  uVar3 = STATE[uVar2];
  iVar4 = 0x140;
  do {
    state_i = (int)uVar2 + 1U & 0x1f;
    uVar2 = (ulong)state_i;
    uVar3 = uVar3 + STATE[uVar2];
    STATE[uVar2] = uVar3;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  return;
}

Assistant:

void Rand_state_init(uint32_t seed)
{
	int i, j;

	/* Seed the table */
	STATE[0] = seed;

	/* Propagate the seed */
	for (i = 1; i < RAND_DEG; i++)
		STATE[i] = LCRNG(STATE[i - 1]);

	/* Cycle the table ten times per degree */
	for (i = 0; i < RAND_DEG * 10; i++) {
		/* Acquire the next index */
		j = (state_i + 1) % RAND_DEG;

		/* Update the table, extract an entry */
		STATE[j] += STATE[state_i];

		/* Advance the index */
		state_i = j;
	}
}